

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

int lyb_parse_attr_name(lys_module *mod,char *data,lys_ext_instance_complex **ext,int options,
                       lyb_state *lybs)

{
  int iVar1;
  lys_ext_instance_complex *local_68;
  char *local_60;
  char *attr_name;
  lys_submodule *submod;
  int k;
  int j;
  int i;
  int pos;
  int ret;
  int r;
  lyb_state *lybs_local;
  lys_ext_instance_complex **pplStack_28;
  int options_local;
  lys_ext_instance_complex **ext_local;
  char *data_local;
  lys_module *mod_local;
  
  i = 0;
  attr_name = (char *)0x0;
  local_60 = (char *)0x0;
  _ret = lybs;
  lybs_local._4_4_ = options;
  pplStack_28 = ext;
  ext_local = (lys_ext_instance_complex **)data;
  data_local = (char *)mod;
  pos = lyb_read_string(data,&local_60,1,lybs);
  i = pos + i;
  if (pos < 0) {
    mod_local._4_4_ = -1;
  }
  else {
    ext_local = (lys_ext_instance_complex **)((long)ext_local + (long)pos);
    j = -1;
    k = 0;
    submod._4_4_ = 0;
    while( true ) {
      if (((int)(uint)(byte)data_local[0x50] <= k) ||
         (submod._4_4_ = lys_ext_instance_presence
                                   (*(lys_ext **)(**(long **)(*(long *)data_local + 0x40) + 0x98),
                                    (lys_ext_instance **)
                                    (*(long *)(data_local + 0xa0) + (long)k * 8),
                                    data_local[0x50] - (char)k), submod._4_4_ == -1))
      goto LAB_00164f6d;
      iVar1 = ly_strequal_(*(char **)(*(long *)(*(long *)(data_local + 0xa0) +
                                               (long)(k + submod._4_4_) * 8) + 0x10),local_60);
      if (iVar1 != 0) break;
      k = k + submod._4_4_ + 1;
    }
    j = k + submod._4_4_;
LAB_00164f6d:
    if (j == -1) {
      for (submod._0_4_ = 0; (int)submod < (int)(uint)(byte)data_local[0x46];
          submod._0_4_ = (int)submod + 1) {
        attr_name = *(char **)(*(long *)(data_local + 0x68) + (long)(int)submod * 0x30);
        k = 0;
        submod._4_4_ = 0;
        while( true ) {
          if (((int)(uint)(byte)attr_name[0x50] <= k) ||
             (submod._4_4_ = lys_ext_instance_presence
                                       (*(lys_ext **)
                                         (**(long **)(*(long *)data_local + 0x40) + 0x98),
                                        (lys_ext_instance **)
                                        (*(long *)(attr_name + 0xa0) + (long)k * 8),
                                        attr_name[0x50] - (char)k), submod._4_4_ == -1))
          goto LAB_0016505d;
          iVar1 = ly_strequal_(*(char **)(*(long *)(*(long *)(attr_name + 0xa0) +
                                                   (long)(k + submod._4_4_) * 8) + 0x10),local_60);
          if (iVar1 != 0) break;
          k = k + submod._4_4_ + 1;
        }
        j = k + submod._4_4_;
LAB_0016505d:
      }
    }
    if (j == -1) {
      *pplStack_28 = (lys_ext_instance_complex *)0x0;
    }
    else {
      if (attr_name == (char *)0x0) {
        local_68 = *(lys_ext_instance_complex **)(*(long *)(data_local + 0xa0) + (long)j * 8);
      }
      else {
        local_68 = *(lys_ext_instance_complex **)(*(long *)(attr_name + 0xa0) + (long)j * 8);
      }
      *pplStack_28 = local_68;
    }
    if ((*pplStack_28 == (lys_ext_instance_complex *)0x0) && ((lybs_local._4_4_ & 0x200) != 0)) {
      ly_vlog(*(ly_ctx **)data_local,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "Failed to find annotation \"%s\" in \"%s\".",local_60,*(undefined8 *)(data_local + 8)
             );
      free(local_60);
      mod_local._4_4_ = -1;
    }
    else {
      free(local_60);
      mod_local._4_4_ = i;
    }
  }
  return mod_local._4_4_;
}

Assistant:

static int
lyb_parse_attr_name(const struct lys_module *mod, const char *data, struct lys_ext_instance_complex **ext, int options,
                    struct lyb_state *lybs)
{
    int r, ret = 0, pos, i, j, k;
    const struct lys_submodule *submod = NULL;
    char *attr_name = NULL;

    /* attr name */
    ret += (r = lyb_read_string(data, &attr_name, 1, lybs));
    LYB_HAVE_READ_RETURN(r, data, -1);

    /* search module */
    pos = -1;
    for (i = 0, j = 0; i < mod->ext_size; i = i + j + 1) {
        j = lys_ext_instance_presence(&mod->ctx->models.list[0]->extensions[0], &mod->ext[i], mod->ext_size - i);
        if (j == -1) {
            break;
        }
        if (ly_strequal(mod->ext[i + j]->arg_value, attr_name, 0)) {
            pos = i + j;
            break;
        }
    }

    /* try submodules */
    if (pos == -1) {
        for (k = 0; k < mod->inc_size; ++k) {
            submod = mod->inc[k].submodule;
            for (i = 0, j = 0; i < submod->ext_size; i = i + j + 1) {
                j = lys_ext_instance_presence(&mod->ctx->models.list[0]->extensions[0], &submod->ext[i], submod->ext_size - i);
                if (j == -1) {
                    break;
                }
                if (ly_strequal(submod->ext[i + j]->arg_value, attr_name, 0)) {
                    pos = i + j;
                    break;
                }
            }
        }
    }

    if (pos == -1) {
        *ext = NULL;
    } else {
        *ext = submod ? (struct lys_ext_instance_complex *)submod->ext[pos] : (struct lys_ext_instance_complex *)mod->ext[pos];
    }

    if (!*ext && (options & LYD_OPT_STRICT)) {
        LOGVAL(mod->ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Failed to find annotation \"%s\" in \"%s\".", attr_name, mod->name);
        free(attr_name);
        return -1;
    }

    free(attr_name);
    return ret;
}